

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

void __thiscall spvtools::Optimizer::Optimizer(Optimizer *this,spv_target_env env)

{
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> this_00;
  
  this_00._M_head_impl = (Impl *)::operator_new(0xa0);
  Impl::Impl(this_00._M_head_impl,env);
  (this->impl_)._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  if (env != SPV_ENV_WEBGPU_0) {
    return;
  }
  __assert_fail("env != SPV_ENV_WEBGPU_0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                ,0x4e,"spvtools::Optimizer::Optimizer(spv_target_env)");
}

Assistant:

Optimizer::Optimizer(spv_target_env env) : impl_(new Impl(env)) {
  assert(env != SPV_ENV_WEBGPU_0);
}